

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 08.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  char x;
  char eme [8];
  
  setlocale(6," ");
  builtin_strncpy(eme,"\x1b[1;36m",8);
  std::operator<<((ostream *)&std::cout,eme);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "sobre os livros de Nietzsche para cada alternativa digite: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "---------------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"(a) Se o trecho se referir ao Livro Aurora.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "(w) se o trecho se referir ao livro um problema para musicos.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "(z) Se o trecho se referir ao livro Assim Falou Zaratustra.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "(b) Se o trecho se referir ao livro Wagner em Bayreuth.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Como nos fazem bem as tardes bronzeas da sua felicidade ");
  std::operator<<((ostream *)&std::cout,"Olhamos pra fora ao ouvi-la: Ja vimos o mar tao liso? ");
  std::operator<<((ostream *)&std::cout,"E como a danca moura nos fala de modo tranquilizador! ");
  std::operator<<((ostream *)&std::cout,
                  "como, em sua lasciva melancolia, mesmo a nossa insaciabilidade ");
  poVar1 = std::operator<<((ostream *)&std::cout,"aprende a satisfacao!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Digite o caracter correspondente ao livro que cita esse trecho: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  pcVar2 = anon_var_dwarf_98f;
  if (x == 'w') {
    pcVar2 = "Excelente!Caminhemos para o proximo destino!";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Temos que aprender a pensar de outra forma- para enfim, ");
  poVar1 = std::operator<<((ostream *)&std::cout,"talvez bem mais tarde, sentir de outra forma!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Digite o caracter correspondente ao livro que cita esse trecho: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  pcVar2 = "Noopz. Esse trecho foi retirado do livro \'Aurora\'(p.75)!";
  if (x == 'a') {
    pcVar2 = "Bravo!!Hoje nasceu uma aurora!";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Nenhum pastor e um so rebanho! Todos querem o mesmo, ");
  std::operator<<((ostream *)&std::cout,"todos sao iguais: O que pensa de outro modo tende a ir ");
  std::operator<<((ostream *)&std::cout,"para o manicomio.");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Digite o caracter correspondente ao livro que cita esse trecho: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  pcVar2 = "Noopz! Esse trecho foi retirado do livro \'Assim falou zaratustra\'";
  if (x == 'z') {
    pcVar2 = "YESS!Parabens! Es um dos que participa efetivamente do ";
  }
  pcVar3 = "Da primeira parte do preambulo(p.29)";
  if (x == 'z') {
    pcVar3 = "preambulo de zaratustra!";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "A Liberdade nao eh algo que recebemos como se fosse uma dadiva ");
  std::operator<<((ostream *)&std::cout,
                  "o homem livre se faz por si mesmo ao se confrontar com perguntas ");
  std::operator<<((ostream *)&std::cout,
                  "sobre o sentido de sua existencia e, perceber que ninguem, a nao ser ");
  poVar1 = std::operator<<((ostream *)&std::cout,"ele proprio, pode responde-las!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Digite o caracter correspondente ao livro que cita esse trecho: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  pcVar2 = "Esse trecho foi retirado do livro Wagner em Bayreuth(p.25).";
  if (x == 'b') {
    pcVar2 = "Em Bayreuth e em qualquer lugar voce estara certo!";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "Ai, aproxima-se o tempo que o homem nao dara a luz a estrelas; ");
  std::operator<<((ostream *)&std::cout,"aproxima-se o tempo do mais desprezivel dos homens; ");
  poVar1 = std::operator<<((ostream *)&std::cout,"Do que ja nao pode desprezar a si mesmo!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Digite o caracter correspondente ao livro que cita esse trecho: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  if (x == 'z') {
    std::operator<<((ostream *)&std::cout,"Yes! Talvez tu sejas o ultimo homem! Talvez! ");
    pcVar2 = "Avante!";
  }
  else {
    pcVar2 = "Noopz. Esse trexo foi retirado do livro \'Assim falou zaratustra(p.28)\'";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Como soam bem a musica ruim e os maus motivos Quando marchamos sobre um inimigo"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Digite o caracter correspondente ao livro que cita esse trecho: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&x);
  pcVar2 = "Nao. Esse trexo foi retirado do livro \'Aurora\'.";
  if (x == 'a') {
    pcVar2 = "YESS!";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  system("pause");
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, " ");
    char eme[] = {0x1b, '[', '1', ';', '3', '6', 'm', 0};
    cout << eme;

    const char a = 'a';
    const char w = 'w';
    const char z = 'z';
    const char b = 'b';
    char x;

    cout << "sobre os livros de Nietzsche para cada alternativa digite: " << endl;
    cout << "---------------------------------------------------------------------" << endl;
    cout << "(a) Se o trecho se referir ao Livro Aurora." << endl;
    cout << "(w) se o trecho se referir ao livro um problema para musicos." << endl;
    cout << "(z) Se o trecho se referir ao livro Assim Falou Zaratustra." << endl;
    cout << "(b) Se o trecho se referir ao livro Wagner em Bayreuth." << endl;
    cout << "----------------------------------------------------------------------" << endl;

    cout << "Como nos fazem bem as tardes bronzeas da sua felicidade ";
    cout << "Olhamos pra fora ao ouvi-la: Ja vimos o mar tao liso? ";
    cout << "E como a danca moura nos fala de modo tranquilizador! ";
    cout << "como, em sua lasciva melancolia, mesmo a nossa insaciabilidade ";
    cout << "aprende a satisfacao!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == w)
    {
        cout << "Excelente!Caminhemos para o proximo destino!" << endl;
    }
    else
    {
        cout << "Noopz.Esse trecho eh do livro 'Um problema para musicos'(pág.13)" << endl;
    }

    cout << "----------------------------------------------------------------------------" << endl;
    cout << "Temos que aprender a pensar de outra forma- para enfim, ";
    cout << "talvez bem mais tarde, sentir de outra forma!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == a)
    {
        cout << "Bravo!!Hoje nasceu uma aurora!" << endl;
    }
    else
    {
        cout << "Noopz. Esse trecho foi retirado do livro 'Aurora'(p.75)!" << endl;
    }

    cout << "-----------------------------------------------------------------------------" << endl;
    cout << "Nenhum pastor e um so rebanho! Todos querem o mesmo, ";
    cout << "todos sao iguais: O que pensa de outro modo tende a ir ";
    cout << "para o manicomio.";
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == z)
    {
        cout << "YESS!Parabens! Es um dos que participa efetivamente do ";
        cout << "preambulo de zaratustra!" << endl;
    }
    else
    {
        cout << "Noopz! Esse trecho foi retirado do livro 'Assim falou zaratustra'";
        cout << "Da primeira parte do preambulo(p.29)" << endl;
    }

    cout << "------------------------------------------------------------------------------" << endl;
    cout << "A Liberdade nao eh algo que recebemos como se fosse uma dadiva ";
    cout << "o homem livre se faz por si mesmo ao se confrontar com perguntas ";
    cout << "sobre o sentido de sua existencia e, perceber que ninguem, a nao ser ";
    cout << "ele proprio, pode responde-las!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == b)
    {
        cout << "Em Bayreuth e em qualquer lugar voce estara certo!" << endl;
    }
    else
    {
        cout << "Esse trecho foi retirado do livro Wagner em Bayreuth(p.25)." << endl;
    }

    cout << "--------------------------------------------------------------------------------" << endl;
    cout << "Ai, aproxima-se o tempo que o homem nao dara a luz a estrelas; ";
    cout << "aproxima-se o tempo do mais desprezivel dos homens; ";
    cout << "Do que ja nao pode desprezar a si mesmo!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == z)
    {
        cout << "Yes! Talvez tu sejas o ultimo homem! Talvez! ";
        cout << "Avante!";
    }
    else
    {
        cout << "Noopz. Esse trexo foi retirado do livro 'Assim falou zaratustra(p.28)'";
    }
    cout << endl
         << endl;
    cout << "Como soam bem a musica ruim e os maus motivos Quando marchamos sobre um inimigo" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == a)
    {
        cout << "YESS!" << endl;
    }
    else
    {
        cout << "Nao. Esse trexo foi retirado do livro 'Aurora'." << endl;
    }

    system("pause");
    return 0;
}